

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O0

bool __thiscall IceCore::Container::Contains(Container *this,udword entry,udword *location)

{
  uint local_2c;
  udword i;
  udword *location_local;
  udword entry_local;
  Container *this_local;
  
  local_2c = 0;
  while( true ) {
    if (this->mCurNbEntries <= local_2c) {
      return false;
    }
    if (this->mEntries[local_2c] == entry) break;
    local_2c = local_2c + 1;
  }
  if (location != (udword *)0x0) {
    *location = local_2c;
  }
  return true;
}

Assistant:

bool Container::Contains(udword entry, udword* location) const
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			if(location)	*location = i;
			return true;
		}
	}
	return false;
}